

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

bool __thiscall
Clasp::Asp::LogicProgram::pushHead
          (LogicProgram *this,Head_t ht,AtomSpan *head,weight_t slack,RuleBuilder *out)

{
  AtomState *this_00;
  byte *pbVar1;
  size_t sVar2;
  uint *puVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  Body_t BVar7;
  uint uVar8;
  WeightLit_t *pWVar9;
  WeightLit_t *pWVar10;
  Atom_t *pAVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  
  BVar7 = Potassco::RuleBuilder::bodyType(out);
  Potassco::RuleBuilder::start(out,ht);
  sVar2 = head->size;
  if (sVar2 == 0) {
    Potassco::RuleBuilder::head_begin(out);
    bVar6 = true;
  }
  else {
    puVar3 = head->first;
    this_00 = &this->atomState_;
    lVar16 = 0;
    uVar15 = 0;
    bVar5 = false;
    do {
      uVar14 = *(uint *)((long)puVar3 + lVar16);
      if (uVar14 < (this->atomState_).state_.ebo_.size) {
        puVar4 = (this_00->state_).ebo_.buf;
        bVar12 = puVar4[uVar14];
        if ((bVar12 & 0x7f) == 0) goto LAB_001422f1;
        if ((bVar12 & 0x44) == 0) {
          bVar12 = puVar4[uVar14 & 0x3fffffff];
          uVar13 = bVar12 & 1;
          if ((BVar7.val_ == Sum) && ((char)uVar13 != '\0')) {
            pWVar9 = Potassco::RuleBuilder::wlits_begin(out);
            pWVar10 = Potassco::RuleBuilder::wlits_end(out);
            pWVar9 = std::
                     __find_if<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_pred<Clasp::Asp::IsLit>>
                               (pWVar9,pWVar10,*(undefined4 *)((long)puVar3 + lVar16));
            uVar13 = pWVar9->weight;
          }
          uVar14 = bVar12 & 2;
          uVar8 = uVar14 >> 1;
          if ((BVar7.val_ == Sum) && ((char)uVar14 != '\0')) {
            pWVar9 = Potassco::RuleBuilder::wlits_begin(out);
            pWVar10 = Potassco::RuleBuilder::wlits_end(out);
            pWVar9 = std::
                     __find_if<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_pred<Clasp::Asp::IsLit>>
                               (pWVar9,pWVar10,-*(int *)((long)puVar3 + lVar16));
            uVar8 = pWVar9->weight;
          }
          uVar14 = *(uint *)((long)puVar3 + lVar16);
          if (uVar14 < (this->atomState_).state_.ebo_.size) {
            bVar12 = ((this_00->state_).ebo_.buf[uVar14] & 0x20) >> 5;
          }
          else {
            bVar12 = 0;
          }
          if ((bVar12 == 0) && ((int)uVar13 <= slack)) {
            if ((int)uVar8 <= slack) goto LAB_001422f1;
          }
          else {
            bVar5 = true;
          }
        }
      }
      else {
LAB_001422f1:
        Potassco::RuleBuilder::addHead(out,uVar14);
        AtomState::set(this_00,*(Var *)((long)puVar3 + lVar16),'\x04');
        uVar15 = uVar15 + 1;
      }
      lVar16 = lVar16 + 4;
    } while (sVar2 << 2 != lVar16);
    pAVar11 = Potassco::RuleBuilder::head_begin(out);
    if (uVar15 != 0) {
      lVar16 = 0;
      do {
        if (*(uint *)((long)pAVar11 + lVar16) < (this->atomState_).state_.ebo_.size) {
          pbVar1 = (this->atomState_).state_.ebo_.buf + *(uint *)((long)pAVar11 + lVar16);
          *pbVar1 = *pbVar1 & 0xe0;
        }
        lVar16 = lVar16 + 4;
      } while ((ulong)uVar15 << 2 != lVar16);
    }
    bVar6 = true;
    if (bVar5) {
      bVar6 = ht.val_ == Choice && uVar15 != 0;
    }
  }
  return bVar6;
}

Assistant:

bool LogicProgram::pushHead(Head_t ht, const Potassco::AtomSpan& head, weight_t slack, RuleBuilder& out) {
	const uint8 ignoreMask = AtomState::false_flag|AtomState::head_flag;
	uint32 hs = 0;
	bool sat = false, sum = out.bodyType() == Body_t::Sum;
	out.start(ht);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
		if (!atomState_.isSet(*it, AtomState::simp_mask)) {
			out.addHead(*it);
			atomState_.addToHead(*it);
			++hs;
		}
		else if (!atomState_.isSet(*it, ignoreMask)) { // h occurs in B+ and/or B- or is true
			weight_t wp = weight_t(atomState_.inBody(posLit(*it))), wn = weight_t(atomState_.inBody(negLit(*it)));
			if (wp && sum) { wp = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::lit(*it)))->weight; }
			if (wn && sum) { wn = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::neg(*it)))->weight; }
			if (atomState_.isFact(*it) || wp > slack) { sat = true; }
			else if (wn <= slack) {
				out.addHead(*it);
				atomState_.addToHead(*it);
				++hs;
			}
		}
	}
	for (const Atom_t* it = out.head_begin(), *end = it + hs; it != end; ++it) {
		atomState_.clearRule(*it);
	}
	return !sat || (ht == Head_t::Choice && hs);
}